

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_parse_rfc5280_time_internal(CBS *cbs,int is_gentime,int allow_timezone_offset,tm *out_tm)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int tmp;
  CBS copy;
  int offset_minutes;
  int day;
  int offset_hours;
  int sec;
  int min;
  int hour;
  int month;
  int local_7c;
  CBS local_78;
  int local_5c;
  int local_58;
  int local_54;
  uint local_50;
  int local_4c;
  uint local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  
  local_78.data = cbs->data;
  local_78.len = cbs->len;
  iVar3 = cbs_get_two_digits(&local_78,&local_7c);
  iVar4 = local_7c;
  if (is_gentime == 0) {
    if (iVar3 == 0) {
      return 0;
    }
    uVar6 = local_7c + 2000;
    if (0x31 < local_7c) {
      uVar6 = local_7c + 0x76c;
    }
    if (0x801 < (int)uVar6) {
      return 0;
    }
  }
  else {
    if (iVar3 == 0) {
      return 0;
    }
    iVar3 = cbs_get_two_digits(&local_78,&local_7c);
    if (iVar3 == 0) {
      return 0;
    }
    uVar6 = iVar4 * 100 + local_7c;
  }
  iVar4 = cbs_get_two_digits(&local_78,(int *)&local_34);
  if (local_34 - 0xd < 0xfffffff4 || iVar4 == 0) {
    return 0;
  }
  iVar4 = cbs_get_two_digits(&local_78,(int *)&local_48);
  if (iVar4 == 0) {
    return 0;
  }
  if ((int)local_48 < 1) {
    return 0;
  }
  if ((0x15aaU >> (local_34 & 0x1f) & 1) == 0) {
    if ((0xa50U >> (local_34 & 0x1f) & 1) == 0) {
      uVar5 = uVar6 * -0x3d70a3d7 + 0x51eb850;
      if (((uVar5 >> 4 | uVar6 * -0x70000000) < 0xa3d70b) ||
         ((uVar6 & 3) == 0 && 0x28f5c28 < (uVar5 >> 2 | uVar6 * 0x40000000))) {
        if (0x1d < local_48) {
          return 0;
        }
      }
      else if (0x1c < local_48) {
        return 0;
      }
    }
    else if (0x1e < local_48) {
      return 0;
    }
  }
  else if (0x1f < local_48) {
    return 0;
  }
  local_50 = local_48;
  iVar4 = cbs_get_two_digits(&local_78,&local_38);
  if (0x17 < local_38 || iVar4 == 0) {
    return 0;
  }
  local_54 = local_38;
  iVar4 = cbs_get_two_digits(&local_78,&local_3c);
  if (0x3b < local_3c || iVar4 == 0) {
    return 0;
  }
  local_58 = local_3c;
  iVar4 = cbs_get_two_digits(&local_78,&local_40);
  if (0x3b < local_40 || iVar4 == 0) {
    return 0;
  }
  if (local_78.len == 0) {
    return 0;
  }
  puVar1 = local_78.data + 1;
  local_78.len = local_78.len - 1;
  uVar2 = *local_78.data;
  iVar4 = 0;
  local_78.data = puVar1;
  if (uVar2 == '+') {
    local_5c = 1;
  }
  else {
    iVar3 = 0;
    if (uVar2 == 'Z') goto LAB_00276061;
    if (uVar2 != '-') {
      return 0;
    }
    local_5c = -1;
  }
  if (allow_timezone_offset == 0) {
    return 0;
  }
  iVar3 = cbs_get_two_digits(&local_78,&local_44);
  if (0x17 < local_44 || iVar3 == 0) {
    return 0;
  }
  iVar3 = cbs_get_two_digits(&local_78,&local_4c);
  if (0x3b < local_4c || iVar3 == 0) {
    return 0;
  }
  iVar3 = (local_4c * 0x3c + local_44 * 0xe10) * local_5c;
LAB_00276061:
  if (local_78.len == 0) {
    if (out_tm != (tm *)0x0) {
      out_tm->tm_year = uVar6 - 0x76c;
      out_tm->tm_mon = local_34 - 1;
      out_tm->tm_mday = local_50;
      out_tm->tm_hour = local_54;
      out_tm->tm_min = local_58;
      out_tm->tm_sec = local_40;
      if ((iVar3 != 0) && (iVar4 = OPENSSL_gmtime_adj(out_tm,0,(long)iVar3), iVar4 == 0)) {
        return 0;
      }
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int CBS_parse_rfc5280_time_internal(const CBS *cbs, int is_gentime,
                                           int allow_timezone_offset,
                                           struct tm *out_tm) {
  int year, month, day, hour, min, sec, tmp;
  CBS copy = *cbs;
  uint8_t tz;

  if (is_gentime) {
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year = tmp * 100;
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year += tmp;
  } else {
    year = 1900;
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year += tmp;
    if (year < 1950) {
      year += 100;
    }
    if (year >= 2050) {
      return 0;  // A Generalized time must be used.
    }
  }
  if (!cbs_get_two_digits(&copy, &month) || month < 1 ||
      month > 12 ||  // Reject invalid months.
      !cbs_get_two_digits(&copy, &day) ||
      !is_valid_day(year, month, day) ||  // Reject invalid days.
      !cbs_get_two_digits(&copy, &hour) ||
      hour > 23 ||  // Reject invalid hours.
      !cbs_get_two_digits(&copy, &min) ||
      min > 59 ||  // Reject invalid minutes.
      !cbs_get_two_digits(&copy, &sec) || sec > 59 || !CBS_get_u8(&copy, &tz)) {
    return 0;
  }

  int offset_sign = 0;
  switch (tz) {
    case 'Z':
      break;  // We correctly have 'Z' on the end as per spec.
    case '+':
      offset_sign = 1;
      break;  // Should not be allowed per RFC 5280.
    case '-':
      offset_sign = -1;
      break;  // Should not be allowed per RFC 5280.
    default:
      return 0;  // Reject anything else after the time.
  }

  // If allow_timezone_offset is non-zero, allow for a four digit timezone
  // offset to be specified even though this is not allowed by RFC 5280. We are
  // permissive of this for UTCTimes due to the unfortunate existence of
  // artisinally rolled long lived certificates that were baked into places that
  // are now difficult to change. These certificates were generated with the
  // 'openssl' command that permissively allowed the creation of certificates
  // with notBefore and notAfter times specified as strings for direct
  // certificate inclusion on the command line. For context see cl/237068815.
  //
  // TODO(bbe): This has been expunged from public web-pki as the ecosystem has
  // managed to encourage CA compliance with standards. We should find a way to
  // get rid of this or make it off by default.
  int offset_seconds = 0;
  if (offset_sign != 0) {
    if (!allow_timezone_offset) {
      return 0;
    }
    int offset_hours, offset_minutes;
    if (!cbs_get_two_digits(&copy, &offset_hours) ||
        offset_hours > 23 ||  // Reject invalid hours.
        !cbs_get_two_digits(&copy, &offset_minutes) ||
        offset_minutes > 59) {  // Reject invalid minutes.
      return 0;
    }
    offset_seconds = offset_sign * (offset_hours * 3600 + offset_minutes * 60);
  }

  if (CBS_len(&copy) != 0) {
    return 0;  // Reject invalid lengths.
  }

  if (out_tm != NULL) {
    // Fill in the tm fields corresponding to what we validated.
    out_tm->tm_year = year - 1900;
    out_tm->tm_mon = month - 1;
    out_tm->tm_mday = day;
    out_tm->tm_hour = hour;
    out_tm->tm_min = min;
    out_tm->tm_sec = sec;
    if (offset_seconds && !OPENSSL_gmtime_adj(out_tm, 0, offset_seconds)) {
      return 0;
    }
  }
  return 1;
}